

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

void __thiscall
agge::tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
          (blender<unsigned_char,_unsigned_char> *this,uchar *pixels,int x,int y,uint length,
          cover_type *covers)

{
  FailedAssertion *this_00;
  long lVar1;
  string local_90;
  string local_70;
  LocationInfo local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/mocks.h","")
  ;
  ut::LocationInfo::LocationInfo(&local_50,&local_90,0x101);
  if (length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
      operator_delete(local_50.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    lVar1 = 0;
    do {
      pixels[lVar1] = covers[lVar1];
      lVar1 = lVar1 + 1;
    } while (length != (uint)lVar1);
    return;
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Values are equal!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

void operator ()(PixelT *pixels, int x, int y, unsigned int length, const cover_type *covers) const
				{
					assert_not_equal(0u, length);

					int offset = sizeof(cover_type) * 8;
					int mask_x = 0x000000FF << offset;
					int mask_y = 0x0000FF00 << offset;

					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ ((x << offset) & mask_x)
							+ ((y << (offset + 8)) & mask_y));
				}